

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O2

void __thiscall Threadpool::Threadpool(Threadpool *this,unsigned_short size)

{
  (this->tp_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tp_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tp_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
  ::queue<std::deque<std::function<void()>,std::allocator<std::function<void()>>>,void>
            (&this->tp_tasks);
  *(undefined8 *)((long)&(this->tp_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->tp_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->tp_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->tp_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->tp_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->tp_task_cv);
  (this->tp_run)._M_base._M_i = true;
  (this->tp_idl_tnum).super___atomic_base<int>._M_i = 0;
  if (size < 0x41) {
    add_thread(this,size);
    return;
  }
  __assert_fail("size <= THREADPOOL_MAX_NUM",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/../threadpool/threadpool.h"
                ,0x19,"Threadpool::Threadpool(unsigned short)");
}

Assistant:

inline Threadpool(unsigned short size = 4) { 
        assert(size <= THREADPOOL_MAX_NUM);
        add_thread(size); 
    }